

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterable_feature.cc
# Opt level: O2

string * range_to_string<ezy::strong_type<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>const>,____C_A_T_C_H____T_E_S_T____106()::__1_const&>,void,ezy::features::iterable>>
                   (string *__return_storage_ptr__,
                   strong_type<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>,_const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:852:24)_&>,_void,_ezy::features::iterable>
                   *range)

{
  reference pvVar1;
  int *piVar2;
  ostream *poVar3;
  int *piVar4;
  ostringstream ostr;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,"[");
  pvVar1 = (range->
           super_strong_type_base<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>,_const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:852:24)_&>,_true>
           ).
           super_strong_type_payload<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>,_const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:852:24)_&>,_true>
           ._value.orig_range.t;
  piVar2 = *(pointer *)
            ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  for (piVar4 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,*piVar4 + 1);
    std::operator<<(poVar3,", ");
  }
  std::operator<<((ostream *)local_1a0,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string range_to_string(const RangeType& range)
{
  std::ostringstream ostr;
  range_to_stream(ostr, range);
  return ostr.str();
}